

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O2

int jx9Builtin_file_put_contents(jx9_context *pCtx,int nArg,jx9_value **apArg)

{
  uint uVar1;
  jx9_io_stream *pStream;
  void *pvVar2;
  _func_jx9_int64_void_ptr_void_ptr_jx9_int64 *p_Var3;
  jx9_int64 iValue;
  int iFlags;
  char *pcVar4;
  jx9_vm *pVm;
  uint use_include;
  jx9_value *pResource;
  int nLen;
  char *zFile;
  char *local_38;
  
  if ((nArg < 2) || (((*apArg)->iFlags & 1) == 0)) {
    pcVar4 = "Expecting a file path";
  }
  else {
    zFile = jx9_value_to_string(*apArg,&nLen);
    pStream = jx9VmGetStreamDevice(pCtx->pVm,&zFile,nLen);
    if (pStream != (jx9_io_stream *)0x0) {
      pcVar4 = jx9_value_to_string(apArg[1],&nLen);
      if (nLen < 1) goto LAB_00135b2c;
      local_38 = pcVar4;
      if (nArg == 2) {
        pVm = pCtx->pVm;
        iFlags = 0x1c;
        uVar1 = 0;
        use_include = 0;
LAB_00135be7:
        pResource = (jx9_value *)0x0;
      }
      else {
        uVar1 = jx9_value_to_int(apArg[2]);
        use_include = uVar1 & 1;
        iFlags = (uVar1 & 8) * 2 + 0x1c;
        pVm = pCtx->pVm;
        if ((uint)nArg < 4) goto LAB_00135be7;
        pResource = apArg[3];
      }
      pcVar4 = zFile;
      pvVar2 = jx9StreamOpenHandle(pVm,pStream,zFile,iFlags,use_include,pResource,0,(int *)0x0);
      if (pvVar2 != (void *)0x0) {
        p_Var3 = pStream->xWrite;
        if (p_Var3 == (_func_jx9_int64_void_ptr_void_ptr_jx9_int64 *)0x0) {
          jx9_context_throw_error_format
                    (pCtx,1,"Read-only stream(%s): Cannot perform write operation",pStream->zName);
        }
        else {
          if (((uVar1 & 1) != 0) && (pStream->xLock != (_func_int_void_ptr_int *)0x0)) {
            (*pStream->xLock)(pvVar2,1);
            p_Var3 = pStream->xWrite;
          }
          iValue = (*p_Var3)(pvVar2,local_38,(long)nLen);
          if (0 < iValue) {
            jx9_result_int64(pCtx,iValue);
            goto LAB_00135c87;
          }
        }
        jx9_result_bool(pCtx,0);
LAB_00135c87:
        if (pStream->xClose == (_func_void_void_ptr *)0x0) {
          return 0;
        }
        (*pStream->xClose)(pvVar2);
        return 0;
      }
      jx9_context_throw_error_format(pCtx,1,"IO error while opening \'%s\'",pcVar4);
      goto LAB_00135b2c;
    }
    pcVar4 = "No such stream device, JX9 is returning FALSE";
  }
  jx9_context_throw_error(pCtx,2,pcVar4);
LAB_00135b2c:
  jx9_result_bool(pCtx,0);
  return 0;
}

Assistant:

static int jx9Builtin_file_put_contents(jx9_context *pCtx, int nArg, jx9_value **apArg)
{
	int use_include  = FALSE;
	const jx9_io_stream *pStream;
	const char *zFile;
	const char *zData;
	int iOpenFlags;
	void *pHandle;
	int iFlags;
	int nLen;
	
	if( nArg < 2 || !jx9_value_is_string(apArg[0]) ){
		/* Missing/Invalid arguments, return FALSE */
		jx9_context_throw_error(pCtx, JX9_CTX_WARNING, "Expecting a file path");
		jx9_result_bool(pCtx, 0);
		return JX9_OK;
	}
	/* Extract the file path */
	zFile = jx9_value_to_string(apArg[0], &nLen);
	/* Point to the target IO stream device */
	pStream = jx9VmGetStreamDevice(pCtx->pVm, &zFile, nLen);
	if( pStream == 0 ){
		jx9_context_throw_error(pCtx, JX9_CTX_WARNING, "No such stream device, JX9 is returning FALSE");
		jx9_result_bool(pCtx, 0);
		return JX9_OK;
	}
	/* Data to write */
	zData = jx9_value_to_string(apArg[1], &nLen);
	if( nLen < 1 ){
		/* Nothing to write, return immediately */
		jx9_result_bool(pCtx, 0);
		return JX9_OK;
	}
	/* Try to open the file in read-write mode */
	iOpenFlags = JX9_IO_OPEN_CREATE|JX9_IO_OPEN_RDWR|JX9_IO_OPEN_TRUNC;
	/* Extract the flags */
	iFlags = 0;
	if( nArg > 2 ){
		iFlags = jx9_value_to_int(apArg[2]);
		if( iFlags & 0x01 /*FILE_USE_INCLUDE_PATH*/){
			use_include = TRUE;
		}
		if( iFlags & 0x08 /* FILE_APPEND */){
			/* If the file already exists, append the data to the file
			 * instead of overwriting it.
			 */
			iOpenFlags &= ~JX9_IO_OPEN_TRUNC;
			/* Append mode */
			iOpenFlags |= JX9_IO_OPEN_APPEND;
		}
	}
	pHandle = jx9StreamOpenHandle(pCtx->pVm, pStream, zFile, iOpenFlags, use_include, 
		nArg > 3 ? apArg[3] : 0, FALSE, FALSE);
	if( pHandle == 0 ){
		jx9_context_throw_error_format(pCtx, JX9_CTX_ERR, "IO error while opening '%s'", zFile);
		jx9_result_bool(pCtx, 0);
		return JX9_OK;
	}
	if( pStream->xWrite ){
		jx9_int64 n;
		if( (iFlags & 0x01/* LOCK_EX */) && pStream->xLock ){
			/* Try to acquire an exclusive lock */
			pStream->xLock(pHandle, 1/* LOCK_EX */);
		}
		/* Perform the write operation */
		n = pStream->xWrite(pHandle, (const void *)zData, nLen);
		if( n < 1 ){
			/* IO error, return FALSE */
			jx9_result_bool(pCtx, 0);
		}else{
			/* Total number of bytes written */
			jx9_result_int64(pCtx, n);
		}
	}else{
		/* Read-only stream */
		jx9_context_throw_error_format(pCtx, JX9_CTX_ERR, 
			"Read-only stream(%s): Cannot perform write operation", 
			pStream ? pStream->zName : "null_stream"
			);
		jx9_result_bool(pCtx, 0);
	}
	/* Close the handle */
	jx9StreamCloseHandle(pStream, pHandle);
	return JX9_OK;
}